

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotate_now(rotating_file_sink<std::mutex> *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  rotating_file_sink<std::mutex> *in_stack_000000e0;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  CLI::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  rotate_(in_stack_000000e0);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x699515);
  return;
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::rotate_now() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    rotate_();
}